

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O2

void cfl_luma_subsampling_444_hbd_c
               (uint16_t *input,int input_stride,uint16_t *output_q3,int width,int height)

{
  ulong uVar1;
  int iVar2;
  int i;
  ulong uVar3;
  
  iVar2 = 0;
  uVar1 = (ulong)(uint)width;
  if (width < 1) {
    uVar1 = 0;
  }
  if (height < 1) {
    height = iVar2;
  }
  for (; iVar2 != height; iVar2 = iVar2 + 1) {
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      output_q3[uVar3] = input[uVar3] << 3;
    }
    output_q3 = output_q3 + 0x20;
    input = input + input_stride;
  }
  return;
}

Assistant:

static void cfl_luma_subsampling_444_hbd_c(const uint16_t *input,
                                           int input_stride,
                                           uint16_t *output_q3, int width,
                                           int height) {
  assert((height - 1) * CFL_BUF_LINE + width <= CFL_BUF_SQUARE);
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i++) {
      output_q3[i] = input[i] << 3;
    }
    input += input_stride;
    output_q3 += CFL_BUF_LINE;
  }
}